

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

string * __thiscall
flatbuffers::python::grpc::anon_unknown_0::BaseGenerator::ModuleForFile
          (string *__return_storage_ptr__,BaseGenerator *this,string *file)

{
  Parser *pPVar1;
  char local_8a [2];
  char *local_88;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_21;
  string *local_20;
  string *file_local;
  BaseGenerator *this_local;
  string *module;
  
  local_21 = 0;
  pPVar1 = this->parser_;
  local_20 = file;
  file_local = (string *)this;
  this_local = (BaseGenerator *)__return_storage_ptr__;
  StripExtension(&local_68,file);
  std::operator+(&local_48,&(pPVar1->opts).include_prefix,&local_68);
  std::operator+(__return_storage_ptr__,&local_48,&(this->parser_->opts).filename_suffix);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  local_80._M_current = (char *)std::__cxx11::string::begin();
  local_88 = (char *)std::__cxx11::string::end();
  local_8a[1] = 0x2f;
  local_8a[0] = '.';
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (local_80,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )local_88,local_8a + 1,local_8a);
  return __return_storage_ptr__;
}

Assistant:

std::string ModuleForFile(const std::string &file) const {
    std::string module = parser_.opts.include_prefix + StripExtension(file) +
                         parser_.opts.filename_suffix;
    std::replace(module.begin(), module.end(), '/', '.');
    return module;
  }